

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_fdset(Curl_multi *multi,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  int iVar1;
  CURLMcode CVar2;
  Curl_llist_node *n;
  Curl_easy *data;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  CVar2 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) &&
     (CVar2 = CURLM_RECURSIVE_API_CALL, (multi->field_0x279 & 4) == 0)) {
    n = Curl_llist_head(&multi->process);
    if (n == (Curl_llist_node *)0x0) {
      iVar6 = -1;
    }
    else {
      iVar6 = -1;
      do {
        data = (Curl_easy *)Curl_node_elem(n);
        multi_getsock(data,&data->last_poll);
        uVar3 = (ulong)(data->last_poll).num;
        if (uVar3 != 0) {
          uVar5 = 0;
          do {
            iVar1 = (data->last_poll).sockets[uVar5];
            if (iVar1 < 0x400) {
              bVar4 = (data->last_poll).actions[uVar5];
              if ((bVar4 & 1) != 0) {
                iVar7 = iVar1 + 0x3f;
                if (-1 < iVar1) {
                  iVar7 = iVar1;
                }
                read_fd_set->fds_bits[iVar7 >> 6] =
                     read_fd_set->fds_bits[iVar7 >> 6] | 1L << ((byte)iVar1 & 0x3f);
                bVar4 = (data->last_poll).actions[uVar5];
              }
              if ((bVar4 & 2) != 0) {
                iVar7 = iVar1 + 0x3f;
                if (-1 < iVar1) {
                  iVar7 = iVar1;
                }
                write_fd_set->fds_bits[iVar7 >> 6] =
                     write_fd_set->fds_bits[iVar7 >> 6] | 1L << ((byte)iVar1 & 0x3f);
              }
              if (iVar6 < iVar1) {
                iVar6 = iVar1;
              }
            }
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
        n = Curl_node_next(n);
      } while (n != (Curl_llist_node *)0x0);
    }
    *max_fd = iVar6;
    CVar2 = CURLM_OK;
  }
  return CVar2;
}

Assistant:

CURLMcode curl_multi_fdset(struct Curl_multi *multi,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  int this_max_fd = -1;
  struct Curl_llist_node *e;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
    struct Curl_easy *data = Curl_node_elem(e);
    unsigned int i;

    multi_getsock(data, &data->last_poll);

    for(i = 0; i < data->last_poll.num; i++) {
      if(!FDSET_SOCK(data->last_poll.sockets[i]))
        /* pretend it does not exist */
        continue;
      if(data->last_poll.actions[i] & CURL_POLL_IN)
        FD_SET(data->last_poll.sockets[i], read_fd_set);
      if(data->last_poll.actions[i] & CURL_POLL_OUT)
        FD_SET(data->last_poll.sockets[i], write_fd_set);
      if((int)data->last_poll.sockets[i] > this_max_fd)
        this_max_fd = (int)data->last_poll.sockets[i];
    }
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}